

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playableWorld.cpp
# Opt level: O2

string * __thiscall
playableWorld::get_agent_direction_abi_cxx11_(string *__return_storage_ptr__,playableWorld *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->agent_direction);
  return __return_storage_ptr__;
}

Assistant:

string playableWorld::get_agent_direction(){
  return agent_direction;
}